

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O1

Vec_Int_t * Gia_ManProcessOutputs(Vec_Ptr_t *vCexesIn,Vec_Ptr_t *vCexesOut,Vec_Int_t *vOutMap)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = vCexesIn->nSize;
  if (iVar9 != vOutMap->nSize) {
    __assert_fail("Vec_PtrSize(vCexesIn) == Vec_IntSize(vOutMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMulti.c"
                  ,0x37,"Vec_Int_t *Gia_ManProcessOutputs(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
  }
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar7 = iVar9;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  pVVar4->pArray = piVar5;
  uVar3 = vOutMap->nSize;
  uVar6 = (ulong)uVar3;
  if (0 < (int)uVar3) {
    lVar10 = 0;
    do {
      iVar9 = vOutMap->pArray[lVar10];
      lVar8 = (long)iVar9;
      if ((lVar8 < 0) || (vCexesOut->nSize <= iVar9)) {
LAB_005811f3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (vCexesOut->pArray[lVar8] != (void *)0x0) {
        __assert_fail("Vec_PtrEntry(vCexesOut, iOut) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMulti.c"
                      ,0x3b,
                      "Vec_Int_t *Gia_ManProcessOutputs(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
      }
      if (vCexesIn->nSize <= lVar10) goto LAB_005811f3;
      pvVar2 = vCexesIn->pArray[lVar10];
      if (pvVar2 == (void *)0x0) {
        uVar3 = pVVar4->nSize;
        lVar8 = (long)(int)uVar3;
        if ((lVar8 < 0) || ((int)uVar6 <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vOutMap->pArray[lVar8] = iVar9;
        uVar1 = pVVar4->nCap;
        if (uVar3 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(0x40);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,0x40);
            }
            pVVar4->pArray = piVar5;
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar1 * 2;
            if (iVar9 <= (int)uVar1) goto LAB_005811af;
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc((ulong)uVar1 << 3);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar1 << 3);
            }
            pVVar4->pArray = piVar5;
          }
          if (piVar5 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar4->nCap = iVar9;
        }
LAB_005811af:
        pVVar4->nSize = uVar3 + 1;
        pVVar4->pArray[lVar8] = (int)lVar10;
      }
      else {
        vCexesIn->pArray[lVar10] = (void *)0x0;
        vCexesOut->pArray[lVar8] = pvVar2;
      }
      lVar10 = lVar10 + 1;
      uVar3 = vOutMap->nSize;
      uVar6 = (ulong)(int)uVar3;
    } while (lVar10 < (long)uVar6);
  }
  if (pVVar4->nSize <= (int)uVar3) {
    vOutMap->nSize = pVVar4->nSize;
    return pVVar4;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Divides outputs into solved and unsolved.]

  Description [Return array of unsolved outputs to extract into a new AIG.
  Updates the resulting CEXes (vCexesOut) and current output map (vOutMap).]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_ManProcessOutputs( Vec_Ptr_t * vCexesIn, Vec_Ptr_t * vCexesOut, Vec_Int_t * vOutMap )
{
    Abc_Cex_t * pCex; 
    Vec_Int_t * vLeftOver;
    int i, iOut;
    assert( Vec_PtrSize(vCexesIn) == Vec_IntSize(vOutMap) );
    vLeftOver = Vec_IntAlloc( Vec_PtrSize(vCexesIn) );
    Vec_IntForEachEntry( vOutMap, iOut, i )
    {
        assert( Vec_PtrEntry(vCexesOut, iOut) == NULL );
        pCex = (Abc_Cex_t *)Vec_PtrEntry( vCexesIn, i );
        if ( pCex ) // found a CEX for output iOut
        {
            Vec_PtrWriteEntry( vCexesIn, i, NULL );
            Vec_PtrWriteEntry( vCexesOut, iOut, pCex );
        }
        else // still unsolved
        {
            Vec_IntWriteEntry( vOutMap, Vec_IntSize(vLeftOver), iOut );
            Vec_IntPush( vLeftOver, i );
        }
    }
    Vec_IntShrink( vOutMap, Vec_IntSize(vLeftOver) );
    return vLeftOver;
}